

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = this->w;
  iVar2 = this->h;
  iVar3 = this->d;
  iVar4 = this->c;
  if (iVar3 * iVar4 * iVar2 * iVar1 == _h * _w) {
    iVar5 = this->dims;
    if ((iVar5 < 3) || (this->cstep == (long)iVar3 * (long)iVar2 * (long)iVar1)) {
      __return_storage_ptr__->data = this->data;
      piVar6 = this->refcount;
      __return_storage_ptr__->refcount = piVar6;
      __return_storage_ptr__->elemsize = this->elemsize;
      __return_storage_ptr__->elempack = this->elempack;
      __return_storage_ptr__->allocator = this->allocator;
      __return_storage_ptr__->dims = iVar5;
      __return_storage_ptr__->w = iVar1;
      __return_storage_ptr__->h = iVar2;
      __return_storage_ptr__->d = iVar3;
      __return_storage_ptr__->c = iVar4;
      __return_storage_ptr__->cstep = this->cstep;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = _h;
      __return_storage_ptr__->d = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_h * (long)_w;
    }
    else {
      __return_storage_ptr__->cstep = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->d = 0;
      __return_storage_ptr__->c = 0;
      create(__return_storage_ptr__,_w,_h,this->elemsize,this->elempack,_allocator);
      if (0 < this->c) {
        pvVar7 = __return_storage_ptr__->data;
        lVar9 = 0;
        do {
          lVar8 = this->elemsize * lVar9;
          memcpy((void *)((long)this->w * (long)this->h * lVar8 * (long)this->d + (long)pvVar7),
                 (void *)(this->cstep * lVar8 + (long)this->data),
                 (long)this->h * (long)this->d * this->elemsize * (long)this->w);
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->c);
      }
    }
  }
  else {
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::reshape(int _w, int _h, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h)
        return Mat();

    if (dims >= 3 && cstep != (size_t)w * h * d)
    {
        Mat m;
        m.create(_w, _h, elemsize, elempack, _allocator);

        // flatten
        for (int i = 0; i < c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + (size_t)i * w * h * d * elemsize;
            memcpy(mptr, ptr, (size_t)w * h * d * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = 1;

    m.cstep = (size_t)_w * _h;

    return m;
}